

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_decompress1X2_usingDTable_internal_bmi2
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  undefined2 *puVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  undefined2 *local_38;
  
  if (cSrcSize == 0) {
    return 0xffffffffffffffb8;
  }
  puVar6 = (undefined2 *)dst;
  if (cSrcSize < 8) {
    uVar4 = (ulong)*cSrc;
    switch(cSrcSize) {
    case 7:
      uVar4 = uVar4 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
    case 6:
      uVar4 = uVar4 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
    case 5:
      uVar4 = uVar4 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
    case 4:
      uVar4 = uVar4 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
    case 3:
      uVar4 = uVar4 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
    case 2:
      uVar4 = uVar4 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
    }
    bVar1 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar1 == 0) {
      return 0xffffffffffffffec;
    }
    uVar9 = (ulong)(LZCOUNT((uint)bVar1) + (int)cSrcSize * -8 + 0x29);
    uVar13 = *DTable;
    uVar8 = uVar13 >> 0x10;
    lVar5 = 0;
    if (dstSize < 8) goto LAB_001bbaf6;
  }
  else {
    bVar1 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar1 == 0) {
      return 0xffffffffffffffff;
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    lVar5 = cSrcSize - 8;
    uVar4 = *(ulong *)((long)cSrc + (cSrcSize - 8));
    uVar11 = (LZCOUNT((uint)bVar1) ^ 0xffffffe0U) + 9;
    uVar9 = (ulong)uVar11;
    uVar13 = *DTable;
    uVar8 = uVar13 >> 0x10;
    if (dstSize < 8) {
      if ((long)cSrcSize < 0x10) {
        if (lVar5 == 0) {
LAB_001bbadf:
          lVar5 = 0;
          goto LAB_001bbaf6;
        }
        uVar13 = (uint)lVar5;
        if (cSrc <= (void *)((long)cSrc + (lVar5 - (ulong)(uVar11 >> 3)))) {
          uVar13 = uVar11 >> 3;
        }
        uVar11 = uVar11 + uVar13 * -8;
      }
      else {
        uVar13 = uVar11 >> 3;
        uVar11 = uVar11 & 7;
      }
      uVar9 = (ulong)uVar11;
      lVar5 = lVar5 - (ulong)uVar13;
      uVar4 = *(ulong *)((long)cSrc + lVar5);
      goto LAB_001bbaf6;
    }
  }
  uVar11 = -uVar8 & 0x3f;
  if ((uVar13 & 0xfc0000) < 0xc0000) {
    do {
      if (lVar5 < 8) {
        if (lVar5 == 0) goto LAB_001bbadf;
        uVar13 = (uint)(uVar9 >> 3);
        bVar14 = cSrc <= (void *)((long)cSrc + (lVar5 - (uVar9 >> 3)));
        if (!bVar14) {
          uVar13 = (uint)lVar5;
        }
        uVar12 = (uint)uVar9 + uVar13 * -8;
      }
      else {
        uVar13 = (uint)(uVar9 >> 3);
        uVar12 = (uint)uVar9 & 7;
        bVar14 = true;
      }
      uVar9 = (ulong)uVar12;
      lVar5 = lVar5 - (ulong)uVar13;
      uVar4 = *(ulong *)((long)cSrc + lVar5);
      if (((undefined2 *)((long)dst + (dstSize - 9)) <= puVar6) || (!bVar14)) break;
      uVar9 = (uVar4 << (uVar9 & 0x3f)) >> uVar11;
      *puVar6 = (short)DTable[uVar9 + 1];
      uVar12 = *(byte *)((long)DTable + uVar9 * 4 + 6) + uVar12;
      uVar10 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
      uVar9 = (uVar4 << ((ulong)uVar12 & 0x3f)) >> uVar11;
      *(short *)((long)puVar6 + uVar10) = (short)DTable[uVar9 + 1];
      uVar12 = *(byte *)((long)DTable + uVar9 * 4 + 6) + uVar12;
      uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
      lVar2 = uVar9 + uVar10;
      uVar7 = (uVar4 << ((ulong)uVar12 & 0x3f)) >> uVar11;
      *(short *)((long)puVar6 + uVar9 + uVar10) = (short)DTable[uVar7 + 1];
      uVar12 = *(byte *)((long)DTable + uVar7 * 4 + 6) + uVar12;
      uVar9 = (ulong)*(byte *)((long)DTable + uVar7 * 4 + 7);
      lVar3 = uVar9 + lVar2;
      uVar7 = (uVar4 << ((ulong)uVar12 & 0x3f)) >> uVar11;
      *(short *)((long)puVar6 + uVar9 + lVar2) = (short)DTable[uVar7 + 1];
      uVar12 = *(byte *)((long)DTable + uVar7 * 4 + 6) + uVar12;
      uVar10 = (ulong)*(byte *)((long)DTable + uVar7 * 4 + 7);
      uVar7 = (uVar4 << ((ulong)uVar12 & 0x3f)) >> uVar11;
      *(short *)((long)puVar6 + uVar10 + lVar3) = (short)DTable[uVar7 + 1];
      uVar12 = *(byte *)((long)DTable + uVar7 * 4 + 6) + uVar12;
      uVar9 = (ulong)uVar12;
      puVar6 = (undefined2 *)
               ((long)puVar6 + (ulong)*(byte *)((long)DTable + uVar7 * 4 + 7) + uVar10 + lVar3);
    } while (uVar12 < 0x41);
  }
  else {
    do {
      if (lVar5 < 8) {
        if (lVar5 == 0) goto LAB_001bbadf;
        uVar13 = (uint)(uVar9 >> 3);
        bVar14 = cSrc <= (void *)((long)cSrc + (lVar5 - (uVar9 >> 3)));
        if (!bVar14) {
          uVar13 = (uint)lVar5;
        }
        uVar12 = (uint)uVar9 + uVar13 * -8;
      }
      else {
        uVar13 = (uint)(uVar9 >> 3);
        uVar12 = (uint)uVar9 & 7;
        bVar14 = true;
      }
      uVar9 = (ulong)uVar12;
      lVar5 = lVar5 - (ulong)uVar13;
      uVar4 = *(ulong *)((long)cSrc + lVar5);
      if (((undefined2 *)((long)dst + (dstSize - 7)) <= puVar6) || (!bVar14)) break;
      uVar9 = (uVar4 << (uVar9 & 0x3f)) >> uVar11;
      *puVar6 = (short)DTable[uVar9 + 1];
      uVar12 = *(byte *)((long)DTable + uVar9 * 4 + 6) + uVar12;
      uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
      uVar7 = (uVar4 << ((ulong)uVar12 & 0x3f)) >> uVar11;
      *(short *)((long)puVar6 + uVar9) = (short)DTable[uVar7 + 1];
      uVar12 = *(byte *)((long)DTable + uVar7 * 4 + 6) + uVar12;
      uVar7 = (ulong)*(byte *)((long)DTable + uVar7 * 4 + 7);
      lVar2 = uVar7 + uVar9;
      uVar10 = (uVar4 << ((ulong)uVar12 & 0x3f)) >> uVar11;
      *(short *)((long)puVar6 + uVar7 + uVar9) = (short)DTable[uVar10 + 1];
      uVar12 = *(byte *)((long)DTable + uVar10 * 4 + 6) + uVar12;
      uVar10 = (ulong)*(byte *)((long)DTable + uVar10 * 4 + 7);
      uVar7 = (uVar4 << ((ulong)uVar12 & 0x3f)) >> uVar11;
      *(short *)((long)puVar6 + uVar10 + lVar2) = (short)DTable[uVar7 + 1];
      uVar12 = *(byte *)((long)DTable + uVar7 * 4 + 6) + uVar12;
      uVar9 = (ulong)uVar12;
      puVar6 = (undefined2 *)
               ((long)puVar6 + (ulong)*(byte *)((long)DTable + uVar7 * 4 + 7) + uVar10 + lVar2);
    } while (uVar12 < 0x41);
  }
LAB_001bbaf6:
  local_38 = (undefined2 *)((long)dst + dstSize);
  if (1 < (ulong)((long)local_38 - (long)puVar6)) {
    for (; uVar13 = (uint)uVar9, uVar13 < 0x41;
        uVar9 = (ulong)(*(byte *)((long)DTable + uVar9 * 4 + 6) + uVar13)) {
      if (lVar5 < 8) {
        if (lVar5 == 0) {
          lVar5 = 0;
          break;
        }
        uVar11 = (uint)(uVar9 >> 3);
        bVar14 = cSrc <= (void *)((long)cSrc + (lVar5 - (uVar9 >> 3)));
        if (!bVar14) {
          uVar11 = (uint)lVar5;
        }
        uVar13 = uVar13 + uVar11 * -8;
      }
      else {
        uVar11 = (uint)(uVar9 >> 3);
        uVar13 = uVar13 & 7;
        bVar14 = true;
      }
      uVar9 = (ulong)uVar13;
      lVar5 = lVar5 - (ulong)uVar11;
      uVar4 = *(ulong *)((long)cSrc + lVar5);
      if ((local_38 + -1 < puVar6) || (!bVar14)) break;
      uVar9 = (uVar4 << (uVar9 & 0x3f)) >> (-uVar8 & 0x3f);
      *puVar6 = (short)DTable[uVar9 + 1];
      puVar6 = (undefined2 *)((long)puVar6 + (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7));
    }
    for (; puVar6 <= local_38 + -1;
        puVar6 = (undefined2 *)((ulong)*(byte *)((long)DTable + uVar7 * 4 + 7) + (long)puVar6)) {
      uVar7 = (uVar4 << (uVar9 & 0x3f)) >> (-uVar8 & 0x3f);
      *puVar6 = (short)DTable[uVar7 + 1];
      uVar9 = (ulong)((uint)*(byte *)((long)DTable + uVar7 * 4 + 6) + (int)uVar9);
    }
  }
  uVar13 = (uint)uVar9;
  if (puVar6 < local_38) {
    uVar4 = (uVar4 << (uVar9 & 0x3f)) >> ((ulong)(byte)-(char)uVar8 & 0x3f);
    *(char *)puVar6 = (char)DTable[uVar4 + 1];
    if (*(char *)((long)DTable + uVar4 * 4 + 7) == '\x01') {
      uVar13 = uVar13 + *(byte *)((long)DTable + uVar4 * 4 + 6);
    }
    else if (uVar13 < 0x40) {
      uVar8 = uVar13 + *(byte *)((long)DTable + uVar4 * 4 + 6);
      uVar13 = 0x40;
      if (uVar8 < 0x40) {
        uVar13 = uVar8;
      }
    }
  }
  if (uVar13 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (lVar5 != 0) {
    dstSize = 0xffffffffffffffec;
  }
  return dstSize;
}

Assistant:

MEM_STATIC size_t BIT_initDStream(BIT_DStream_t* bitD, const void* srcBuffer, size_t srcSize)
{
    if (srcSize < 1) { ZSTD_memset(bitD, 0, sizeof(*bitD)); return ERROR(srcSize_wrong); }

    bitD->start = (const char*)srcBuffer;
    bitD->limitPtr = bitD->start + sizeof(bitD->bitContainer);

    if (srcSize >=  sizeof(bitD->bitContainer)) {  /* normal case */
        bitD->ptr   = (const char*)srcBuffer + srcSize - sizeof(bitD->bitContainer);
        bitD->bitContainer = MEM_readLEST(bitD->ptr);
        { BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
          bitD->bitsConsumed = lastByte ? 8 - ZSTD_highbit32(lastByte) : 0;  /* ensures bitsConsumed is always set */
          if (lastByte == 0) return ERROR(GENERIC); /* endMark not present */ }
    } else {
        bitD->ptr   = bitD->start;
        bitD->bitContainer = *(const BYTE*)(bitD->start);
        switch(srcSize)
        {
        case 7: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[6]) << (sizeof(bitD->bitContainer)*8 - 16);
                ZSTD_FALLTHROUGH;

        case 6: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[5]) << (sizeof(bitD->bitContainer)*8 - 24);
                ZSTD_FALLTHROUGH;

        case 5: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[4]) << (sizeof(bitD->bitContainer)*8 - 32);
                ZSTD_FALLTHROUGH;

        case 4: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[3]) << 24;
                ZSTD_FALLTHROUGH;

        case 3: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[2]) << 16;
                ZSTD_FALLTHROUGH;

        case 2: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[1]) <<  8;
                ZSTD_FALLTHROUGH;

        default: break;
        }
        {   BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
            bitD->bitsConsumed = lastByte ? 8 - ZSTD_highbit32(lastByte) : 0;
            if (lastByte == 0) return ERROR(corruption_detected);  /* endMark not present */
        }
        bitD->bitsConsumed += (U32)(sizeof(bitD->bitContainer) - srcSize)*8;
    }

    return srcSize;
}